

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  SPIRVariable *var_00;
  SmallVector<Resource,_8UL> *this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t type_00;
  uint32_t value;
  SPIRType *pSVar3;
  ulong uVar4;
  Resource *pRVar5;
  Resource *pRVar6;
  MSLResourceBinding *rez_bind_00;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar7;
  size_type sVar8;
  CompilerError *pCVar9;
  mapped_type *pmVar10;
  size_type sVar11;
  size_type sVar12;
  SmallVector<Resource,_8UL> *local_1b00;
  uint32_t local_1a04;
  SmallVector<Resource,_8UL> *local_18f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e8 [32];
  spirv_cross local_18c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8 [32];
  spirv_cross local_1888 [32];
  pair<unsigned_int,_unsigned_int> local_1868;
  TypedID<(spirv_cross::Types)1> local_1860;
  TypedID<(spirv_cross::Types)0> local_185c;
  SPIRType *local_1858;
  SPIRType *atomic_ptr_type;
  undefined1 local_1848 [8];
  SPIRType atomic_type;
  uint32_t type_ptr_id;
  uint32_t atomic_type_id;
  uint32_t offset;
  spirv_cross local_16c8 [32];
  TypedID<(spirv_cross::Types)1> local_16a8;
  undefined1 local_16a2;
  allocator local_16a1;
  string local_16a0 [38];
  undefined1 local_167a;
  allocator local_1679;
  string local_1678 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658 [32];
  spirv_cross local_1638 [32];
  TypedID<(spirv_cross::Types)1> local_1618;
  key_type local_1614;
  SetBindingPair pair;
  TypedID<(spirv_cross::Types)1> local_1604;
  uint32_t binding;
  TypedID<(spirv_cross::Types)1> local_15fc;
  SPIRType *local_15f8;
  SPIRType *sampler_type_array;
  SPIRType *pSStack_15e8;
  uint32_t sampler_type_array_id;
  SPIRType *new_sampler_type;
  byte local_15d5;
  uint32_t sampler_type_id;
  spirv_cross local_15d0 [3];
  bool type_is_array;
  allocator local_15a9;
  string local_15a8 [32];
  string local_1588 [32];
  undefined1 local_1568 [8];
  string mbr_name;
  uint32_t local_1544;
  uint32_t elem_cnt;
  MSLResourceBinding *rez_bind;
  SPIRType *type;
  SPIRVariable *var_3;
  Resource *resource;
  Resource *__end2;
  Resource *__begin2;
  SmallVector<Resource,_8UL> *__range2;
  uint32_t local_1500;
  uint32_t next_arg_buff_index;
  uint32_t member_index;
  ID local_14d8;
  StorageClass local_14d4;
  uint32_t local_14d0;
  TypedID<(spirv_cross::Types)1> local_14cc;
  uint32_t buffer_variable_id;
  SPIRType *ptr_type;
  ID local_149c;
  ID local_1498;
  ID local_1494;
  SPIRType *local_1490;
  SPIRType *buffer_type;
  uint32_t local_1480;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t next_id;
  SmallVector<Resource,_8UL> *resources;
  undefined1 auStack_1468 [4];
  uint32_t desc_set_2;
  SPIRVariable *local_1460;
  undefined1 local_1458 [32];
  BaseType local_1438;
  uint32_t local_1434;
  uint32_t local_1430;
  ID local_1428;
  uint local_1424;
  SPIRVariable *pSStack_1420;
  uint32_t desc_set_1;
  SPIRVariable *var_2;
  uint *puStack_1410;
  uint32_t var_id_2;
  uint *__end1_1;
  uint *__begin1_1;
  SmallVector<unsigned_int,_8UL> *__range1_1;
  SPIRVariable *local_13f0;
  undefined1 local_13e8 [32];
  BaseType local_13c8;
  uint32_t local_13c4;
  uint32_t local_13c0;
  ID local_13b4;
  ID local_13b0;
  allocator local_13a9;
  string local_13a8 [32];
  ID local_1388;
  StorageClass local_1384;
  SPIRVariable *local_1380;
  SPIRVariable *var_1;
  undefined1 auStack_1370 [4];
  uint32_t var_id_1;
  SPIRVariable *local_1368;
  undefined1 local_1360 [32];
  BaseType local_1340;
  uint32_t local_133c;
  uint32_t local_1338;
  ID local_132c;
  ID local_1328;
  allocator local_1321;
  string local_1320 [32];
  ID local_1300;
  StorageClass local_12fc;
  SPIRVariable *local_12f8;
  SPIRVariable *var;
  ID local_12e8;
  uint32_t var_id;
  undefined1 local_12e0 [8];
  SPIRType uint_type_pointer;
  uint local_1188;
  uint32_t desc_set;
  uint32_t uint_ptr_type_id;
  anon_class_48_6_f64cba6c local_1178;
  bool local_1141;
  char cStack_1140;
  char cStack_113f;
  char cStack_113e;
  char cStack_113d;
  char cStack_113c;
  char cStack_113b;
  char cStack_113a;
  bool needs_buffer_sizes;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  SmallVector<Resource,_8UL> resources_in_set [8];
  uint32_t *id;
  uint32_t *__end1;
  uint32_t *__begin1;
  uint32_t (*__range1) [8];
  CompilerMSL *this_local;
  
  for (__end1 = this->argument_buffer_ids; __end1 != &this->argument_buffer_discrete_mask;
      __end1 = __end1 + 1) {
    *__end1 = 0;
  }
  local_18f8 = (SmallVector<Resource,_8UL> *)(inline_block_vars.stack_storage.aligned_char + 0x18);
  do {
    SmallVector<Resource,_8UL>::SmallVector(local_18f8);
    local_18f8 = local_18f8 + 1;
  } while (local_18f8 !=
           (SmallVector<Resource,_8UL> *)(resources_in_set[7].stack_storage.aligned_char + 0x1f8));
  SmallVector<unsigned_int,_8UL>::SmallVector
            ((SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer);
  set_needs_buffer_sizes[0] = false;
  set_needs_buffer_sizes[1] = false;
  set_needs_buffer_sizes[2] = false;
  set_needs_buffer_sizes[3] = false;
  set_needs_buffer_sizes[4] = false;
  set_needs_buffer_sizes[5] = false;
  set_needs_buffer_sizes[6] = false;
  set_needs_buffer_sizes[7] = false;
  cStack_1140 = '\0';
  cStack_113f = '\0';
  cStack_113e = '\0';
  cStack_113d = '\0';
  cStack_113c = '\0';
  cStack_113b = '\0';
  cStack_113a = '\0';
  needs_buffer_sizes = false;
  local_1141 = false;
  local_1178.resources_in_set =
       (SmallVector<Resource,_8UL> (*) [8])(inline_block_vars.stack_storage.aligned_char + 0x18);
  local_1178.set_needs_swizzle_buffer = &set_needs_buffer_sizes;
  local_1178.set_needs_buffer_sizes = (bool (*) [8])&stack0xffffffffffffeec0;
  local_1178.needs_buffer_sizes = &local_1141;
  local_1178.this = this;
  local_1178.inline_block_vars = (SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::analyze_argument_buffers()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_1178);
  if (((this->needs_swizzle_buffer_def & 1U) != 0) || ((local_1141 & 1U) != 0)) {
    local_1188 = 0;
    for (uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ = 0;
        uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ < 8;
        uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ =
             uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ + 1) {
      if (((set_needs_buffer_sizes[uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_]
           & 1U) != 0) ||
         ((inline_block_vars.stack_storage.aligned_char
           [(ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ - 0x30] & 1U) !=
          0)) {
        if (local_1188 == 0) {
          local_1188 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          pSVar3 = get_uint_type(this);
          SPIRType::SPIRType((SPIRType *)local_12e0,pSVar3);
          uint_type_pointer.array_size_literal.stack_storage.aligned_char[4] = '\x01';
          uint_type_pointer.array_size_literal.stack_storage.aligned_char._0_4_ =
               uint_type_pointer.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
          uVar2 = get_uint_type_id(this);
          TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&var_id,uVar2);
          uint_type_pointer.image.access = var_id;
          uint_type_pointer.pointer_depth = 2;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)this,local_1188,(SPIRType *)local_12e0);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_12e8,local_1188);
          Compiler::set_decoration((Compiler *)this,local_12e8,DecorationArrayStride,4);
          SPIRType::~SPIRType((SPIRType *)local_12e0);
        }
        if ((set_needs_buffer_sizes[uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_]
            & 1U) != 0) {
          var._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          local_12fc = StorageClassUniformConstant;
          local_12f8 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                 ((Compiler *)this,var._4_4_,&local_1188,&local_12fc);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1300,var._4_4_);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1320,"spvSwizzleConstants",&local_1321);
          Compiler::set_name((Compiler *)this,local_1300,(string *)local_1320);
          ::std::__cxx11::string::~string(local_1320);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1321);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1328,var._4_4_);
          Compiler::set_decoration
                    ((Compiler *)this,local_1328,DecorationDescriptorSet,
                     uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_132c,var._4_4_);
          Compiler::set_decoration((Compiler *)this,local_132c,DecorationBinding,0xfffffffe);
          uVar4 = (ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_;
          _auStack_1370 = local_12f8;
          local_1368 = (SPIRVariable *)0x0;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_1360,this,(ulong)var._4_4_);
          local_1340 = UInt;
          local_133c = get_metal_resource_index(this,local_12f8,UInt,0);
          local_1338 = 0;
          SmallVector<Resource,_8UL>::push_back
                    ((SmallVector<Resource,_8UL> *)
                     (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1f8),
                     (Resource *)auStack_1370);
          analyze_argument_buffers::Resource::~Resource((Resource *)auStack_1370);
        }
        if ((inline_block_vars.stack_storage.aligned_char
             [(ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ - 0x30] & 1U)
            != 0) {
          var_1._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1)
          ;
          local_1384 = StorageClassUniformConstant;
          local_1380 = Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                 ((Compiler *)this,var_1._4_4_,&local_1188,&local_1384);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_1388,var_1._4_4_);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_13a8,"spvBufferSizeConstants",&local_13a9);
          Compiler::set_name((Compiler *)this,local_1388,(string *)local_13a8);
          ::std::__cxx11::string::~string(local_13a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_13b0,var_1._4_4_);
          Compiler::set_decoration
                    ((Compiler *)this,local_13b0,DecorationDescriptorSet,
                     uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_);
          TypedID<(spirv_cross::Types)0>::TypedID(&local_13b4,var_1._4_4_);
          Compiler::set_decoration((Compiler *)this,local_13b4,DecorationBinding,0xfffffffd);
          uVar4 = (ulong)uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_;
          __range1_1 = (SmallVector<unsigned_int,_8UL> *)local_1380;
          local_13f0 = (SPIRVariable *)0x0;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_13e8,this,(ulong)var_1._4_4_);
          local_13c8 = UInt;
          local_13c4 = get_metal_resource_index(this,local_1380,UInt,0);
          local_13c0 = 0;
          SmallVector<Resource,_8UL>::push_back
                    ((SmallVector<Resource,_8UL> *)
                     (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1f8),
                     (Resource *)&__range1_1);
          analyze_argument_buffers::Resource::~Resource((Resource *)&__range1_1);
        }
      }
    }
  }
  __begin1_1 = (uint *)set_needs_swizzle_buffer;
  __end1_1 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_1);
  puStack_1410 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_1);
  for (; __end1_1 != puStack_1410; __end1_1 = __end1_1 + 1) {
    var_2._4_4_ = *__end1_1;
    pSStack_1420 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_2._4_4_);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_1428,var_2._4_4_);
    local_1424 = Compiler::get_decoration((Compiler *)this,local_1428,DecorationDescriptorSet);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,var_2._4_4_);
    uVar4 = (ulong)local_1424;
    _auStack_1468 = pSStack_1420;
    local_1460 = (SPIRVariable *)0x0;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_1458,this,(ulong)var_2._4_4_);
    local_1438 = Struct;
    local_1434 = get_metal_resource_index(this,pSStack_1420,Struct,0);
    local_1430 = 0;
    SmallVector<Resource,_8UL>::push_back
              ((SmallVector<Resource,_8UL> *)
               (resources_in_set[uVar4 - 1].stack_storage.aligned_char + 0x1f8),
               (Resource *)auStack_1468);
    analyze_argument_buffers::Resource::~Resource((Resource *)auStack_1468);
  }
  resources._4_4_ = 0;
  do {
    if (7 < resources._4_4_) {
      SmallVector<unsigned_int,_8UL>::~SmallVector
                ((SmallVector<unsigned_int,_8UL> *)set_needs_swizzle_buffer);
      local_1b00 = (SmallVector<Resource,_8UL> *)
                   (resources_in_set[7].stack_storage.aligned_char + 0x1f8);
      do {
        local_1b00 = local_1b00 + -1;
        SmallVector<Resource,_8UL>::~SmallVector(local_1b00);
      } while (local_1b00 !=
               (SmallVector<Resource,_8UL> *)(inline_block_vars.stack_storage.aligned_char + 0x18));
      return;
    }
    _type_id = (SmallVector<Resource,_8UL> *)
               (resources_in_set[(ulong)resources._4_4_ - 1].stack_storage.aligned_char + 0x1f8);
    bVar1 = VectorView<Resource>::empty((VectorView<Resource> *)_type_id);
    if (!bVar1) {
      bVar1 = descriptor_set_is_argument_buffer(this,resources._4_4_);
      if (!bVar1) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x43c9,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      ptr_type_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
      local_1480 = ptr_type_id + 1;
      buffer_type._4_4_ = ptr_type_id + 2;
      this->argument_buffer_ids[resources._4_4_] = ptr_type_id;
      local_1490 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,local_1480);
      *(undefined4 *)&(local_1490->super_IVariant).field_0xc = 0xf;
      if ((this->argument_buffer_device_storage_mask & 1 << ((byte)resources._4_4_ & 0x1f)) == 0) {
        local_1490->storage = StorageClassUniform;
      }
      else {
        local_1490->storage = StorageClassStorageBuffer;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_1494,ptr_type_id);
        Compiler::set_decoration((Compiler *)this,local_1494,DecorationNonWritable,0);
        TypedID<(spirv_cross::Types)0>::TypedID(&local_1498,local_1480);
        Compiler::set_decoration((Compiler *)this,local_1498,DecorationBlock,0);
      }
      TypedID<(spirv_cross::Types)0>::TypedID(&local_149c,local_1480);
      join<char_const(&)[23],unsigned_int&>
                ((spirv_cross *)&ptr_type,(char (*) [23])"spvDescriptorSetBuffer",
                 (uint *)((long)&resources + 4));
      Compiler::set_name((Compiler *)this,local_149c,(string *)&ptr_type);
      ::std::__cxx11::string::~string((string *)&ptr_type);
      _buffer_variable_id = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,buffer_type._4_4_)
      ;
      SPIRType::operator=(_buffer_variable_id,local_1490);
      _buffer_variable_id->pointer = true;
      _buffer_variable_id->pointer_depth = _buffer_variable_id->pointer_depth + 1;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_14cc,local_1480);
      (_buffer_variable_id->parent_type).id = local_14cc.id;
      local_14d0 = ptr_type_id;
      local_14d4 = StorageClassUniform;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)this,ptr_type_id,(uint *)((long)&buffer_type + 4),&local_14d4);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_14d8,local_14d0);
      join<char_const(&)[17],unsigned_int&>
                ((spirv_cross *)&member_index,(char (*) [17])"spvDescriptorSet",
                 (uint *)((long)&resources + 4));
      Compiler::set_name((Compiler *)this,local_14d8,(string *)&member_index);
      ::std::__cxx11::string::~string((string *)&member_index);
      pRVar5 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource,8ul>>
                         (_type_id);
      pRVar6 = ::std::
               end<spirv_cross::SmallVector<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource,8ul>>
                         (_type_id);
      ::std::
      stable_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>
                (pRVar5,pRVar6);
      this_00 = _type_id;
      local_1500 = 0;
      __range2._4_4_ = 0;
      __end2 = VectorView<Resource>::begin(&_type_id->super_VectorView<Resource>);
      pRVar5 = VectorView<Resource>::end(&this_00->super_VectorView<Resource>);
      for (; __end2 != pRVar5; __end2 = __end2 + 1) {
        var_00 = __end2->var;
        pSVar3 = Compiler::get_variable_data_type((Compiler *)this,var_00);
        if (((this->msl_options).pad_argument_buffer_resources & 1U) != 0) {
          if (__end2->descriptor_alias == (SPIRVariable *)0x0) {
            while (__range2._4_4_ < __end2->index) {
              rez_bind_00 = get_argument_buffer_resource(this,resources._4_4_,__range2._4_4_);
              switch(rez_bind_00->basetype) {
              case Void:
              case Boolean:
              case SByte:
              case UByte:
              case Short:
              case UShort:
              case Int:
              case UInt:
              case Int64:
              case UInt64:
              case AtomicCounter:
              case Half:
              case Float:
              case Double:
                add_argument_buffer_padding_buffer_type
                          (this,local_1490,&local_1500,(uint32_t *)((long)&__range2 + 4),rez_bind_00
                          );
                break;
              default:
                break;
              case Image:
                add_argument_buffer_padding_image_type
                          (this,local_1490,&local_1500,(uint32_t *)((long)&__range2 + 4),rez_bind_00
                          );
                break;
              case SampledImage:
                if (__range2._4_4_ == rez_bind_00->msl_sampler) {
                  add_argument_buffer_padding_sampler_type
                            (this,local_1490,&local_1500,(uint32_t *)((long)&__range2 + 4),
                             rez_bind_00);
                }
                else {
                  add_argument_buffer_padding_image_type
                            (this,local_1490,&local_1500,(uint32_t *)((long)&__range2 + 4),
                             rez_bind_00);
                }
                break;
              case Sampler:
                add_argument_buffer_padding_sampler_type
                          (this,local_1490,&local_1500,(uint32_t *)((long)&__range2 + 4),rez_bind_00
                          );
              }
            }
          }
          bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
          if (bVar1) {
            local_1a04 = 1;
          }
          else {
            local_1a04 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar3);
          }
          local_1544 = local_1a04;
          if (local_1a04 == 0) {
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(var_00->super_IVariant).self);
            local_1544 = get_resource_array_size(this,uVar2);
          }
          __range2._4_4_ = local_1544 + __range2._4_4_;
        }
        ::std::__cxx11::string::string(local_1588,(string *)&__end2->name);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_15a8,"m",&local_15a9);
        ensure_valid_name((CompilerMSL *)local_1568,(string *)this,(string *)local_1588);
        ::std::__cxx11::string::~string(local_15a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
        ::std::__cxx11::string::~string(local_1588);
        if (__end2->plane != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (local_15d0,&this->plane_name_suffix,&__end2->plane);
          ::std::__cxx11::string::operator+=((string *)local_1568,(string *)local_15d0);
          ::std::__cxx11::string::~string((string *)local_15d0);
        }
        sampler_type_id =
             (uint32_t)
             TypedID::operator_cast_to_TypedID((TypedID *)&(local_1490->super_IVariant).self);
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)sampler_type_id,local_1500,(string *)local_1568);
        if ((__end2->basetype == Sampler) && (*(int *)&(pSVar3->super_IVariant).field_0xc != 0x12))
        {
          bVar1 = VectorView<unsigned_int>::empty(&(pSVar3->array).super_VectorView<unsigned_int>);
          local_15d5 = !bVar1;
          new_sampler_type._4_4_ =
               ParsedIR::increase_bound_by
                         (&(this->super_CompilerGLSL).super_Compiler.ir,local_15d5 + 1);
          pSStack_15e8 = Compiler::set<spirv_cross::SPIRType>
                                   ((Compiler *)this,new_sampler_type._4_4_);
          *(undefined4 *)&(pSStack_15e8->super_IVariant).field_0xc = 0x12;
          pSStack_15e8->storage = StorageClassUniformConstant;
          if ((local_15d5 & 1) == 0) {
            pSVar7 = &local_1490->member_types;
            TypedID<(spirv_cross::Types)1>::TypedID(&local_1604,new_sampler_type._4_4_);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,&local_1604);
          }
          else {
            sampler_type_array._4_4_ = new_sampler_type._4_4_ + 1;
            local_15f8 = Compiler::set<spirv_cross::SPIRType>
                                   ((Compiler *)this,sampler_type_array._4_4_);
            SPIRType::operator=(local_15f8,pSStack_15e8);
            SmallVector<unsigned_int,_8UL>::operator=(&local_15f8->array,&pSVar3->array);
            SmallVector<bool,_8UL>::operator=
                      (&local_15f8->array_size_literal,&pSVar3->array_size_literal);
            TypedID<(spirv_cross::Types)1>::TypedID(&local_15fc,new_sampler_type._4_4_);
            (local_15f8->parent_type).id = local_15fc.id;
            pSVar7 = &local_1490->member_types;
            TypedID<(spirv_cross::Types)1>::TypedID
                      ((TypedID<(spirv_cross::Types)1> *)&binding,sampler_type_array._4_4_);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,(TypedID<(spirv_cross::Types)1> *)&binding);
          }
        }
        else {
          pair.desc_set = (var_00->super_IVariant).self.id;
          local_1614.binding =
               Compiler::get_decoration((Compiler *)this,(ID)pair.desc_set,DecorationBinding);
          local_1614.desc_set = resources._4_4_;
          pair.binding = local_1614.binding;
          if ((__end2->basetype == Image) ||
             ((__end2->basetype == Sampler || (__end2->basetype == SampledImage)))) {
            pSVar7 = &local_1490->member_types;
            uVar2 = Compiler::get_variable_data_type_id((Compiler *)this,var_00);
            TypedID<(spirv_cross::Types)1>::TypedID(&local_1618,uVar2);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      (pSVar7,&local_1618);
            if (__end2->plane == 0) {
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(var_00->super_IVariant).self);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_1658,this,(ulong)local_14d0,1);
              join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                        (local_1638,local_1658,(char (*) [2])0x5ea727,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1568);
              Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_1638);
              ::std::__cxx11::string::~string((string *)local_1638);
              ::std::__cxx11::string::~string((string *)local_1658);
            }
          }
          else {
            sVar8 = ::std::
                    map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    ::count(&this->buffers_requiring_dynamic_offset,&local_1614);
            if (sVar8 == 0) {
              sVar11 = ::std::
                       unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
                       ::count(&this->inline_uniform_blocks,&local_1614);
              if (sVar11 == 0) {
                atomic_type_id =
                     TypedID::operator_cast_to_unsigned_int
                               ((TypedID *)&(var_00->super_IVariant).self);
                sVar12 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count(&this->atomic_image_vars,&atomic_type_id);
                if (sVar12 == 0) {
                  if ((__end2->descriptor_alias == (SPIRVariable *)0x0) ||
                     (__end2->descriptor_alias == __end2->var)) {
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                              (&local_1490->member_types,
                               (TypedID<(spirv_cross::Types)1> *)&(var_00->super_IVariant).field_0xc
                              );
                  }
                  if ((__end2->descriptor_alias == (SPIRVariable *)0x0) ||
                     (__end2->descriptor_alias == __end2->var)) {
                    bVar1 = VectorView<unsigned_int>::empty
                                      (&(pSVar3->array).super_VectorView<unsigned_int>);
                    if (bVar1) {
                      uVar2 = TypedID::operator_cast_to_unsigned_int
                                        ((TypedID *)&(var_00->super_IVariant).self);
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                (local_18a8,this,(ulong)local_14d0,1);
                      join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                                (local_1888,(char (*) [3])"(*",local_18a8,(char (*) [2])0x5ea727,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1568,(char (*) [2])0x5eaa1a);
                      Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_1888);
                      ::std::__cxx11::string::~string((string *)local_1888);
                      ::std::__cxx11::string::~string((string *)local_18a8);
                    }
                    else {
                      uVar2 = TypedID::operator_cast_to_unsigned_int
                                        ((TypedID *)&(var_00->super_IVariant).self);
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                (local_18e8,this,(ulong)local_14d0,1);
                      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                                (local_18c8,local_18e8,(char (*) [2])0x5ea727,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1568);
                      Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_18c8);
                      ::std::__cxx11::string::~string((string *)local_18c8);
                      ::std::__cxx11::string::~string((string *)local_18e8);
                    }
                  }
                  else {
                    ::std::pair<unsigned_int,_unsigned_int>::
                    pair<spirv_cross::TypedID<(spirv_cross::Types)0>_&,_spirv_cross::TypedID<(spirv_cross::Types)0>_&,_true>
                              (&local_1868,&(var_00->super_IVariant).self,
                               &(__end2->descriptor_alias->super_IVariant).self);
                    SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::push_back
                              (&this->buffer_aliases_argument,&local_1868);
                  }
                }
                else {
                  atomic_type.member_name_cache._M_h._M_single_bucket._4_4_ =
                       ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
                  atomic_type.member_name_cache._M_h._M_single_bucket._0_4_ =
                       atomic_type.member_name_cache._M_h._M_single_bucket._4_4_ + 1;
                  SPIRType::SPIRType((SPIRType *)local_1848);
                  atomic_type.super_IVariant._vptr_IVariant._4_4_ = 0xb;
                  atomic_type.super_IVariant.self.id = 0x20;
                  atomic_type.super_IVariant._12_4_ = 1;
                  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                            ((Compiler *)this,
                             atomic_type.member_name_cache._M_h._M_single_bucket._4_4_,
                             (SPIRType *)local_1848);
                  atomic_type.array_size_literal.stack_storage.aligned_char[4] = '\x01';
                  atomic_type.array_size_literal.stack_storage.aligned_char._0_4_ =
                       atomic_type.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
                  TypedID<(spirv_cross::Types)1>::TypedID
                            ((TypedID<(spirv_cross::Types)1> *)((long)&atomic_ptr_type + 4),
                             atomic_type.member_name_cache._M_h._M_single_bucket._4_4_);
                  atomic_type.image.access = atomic_ptr_type._4_4_;
                  atomic_type.pointer_depth = 0xc;
                  local_1858 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                         ((Compiler *)this,
                                          (uint32_t)
                                          atomic_type.member_name_cache._M_h._M_single_bucket,
                                          (SPIRType *)local_1848);
                  TypedID<(spirv_cross::Types)0>::TypedID
                            (&local_185c,atomic_type.member_name_cache._M_h._M_single_bucket._4_4_);
                  (local_1858->super_IVariant).self.id = local_185c.id;
                  pSVar7 = &local_1490->member_types;
                  TypedID<(spirv_cross::Types)1>::TypedID
                            (&local_1860,
                             (uint32_t)atomic_type.member_name_cache._M_h._M_single_bucket);
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                            (pSVar7,&local_1860);
                  SPIRType::~SPIRType((SPIRType *)local_1848);
                }
              }
              else {
                if (__end2->descriptor_alias != (SPIRVariable *)0x0) {
                  local_16a2 = 1;
                  pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_16a0,
                             "Descriptor aliasing is currently not supported with inline UBOs.",
                             &local_16a1);
                  CompilerError::CompilerError(pCVar9,(string *)local_16a0);
                  local_16a2 = 0;
                  __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
                }
                pSVar7 = &local_1490->member_types;
                uVar2 = Compiler::get_variable_data_type_id((Compiler *)this,var_00);
                TypedID<(spirv_cross::Types)1>::TypedID(&local_16a8,uVar2);
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                          (pSVar7,&local_16a8);
                uVar2 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(var_00->super_IVariant).self);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&offset,this,(ulong)local_14d0,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          (local_16c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &offset,(char (*) [2])0x5ea727,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1568);
                Compiler::set_qualified_name((Compiler *)this,uVar2,(string *)local_16c8);
                ::std::__cxx11::string::~string((string *)local_16c8);
                ::std::__cxx11::string::~string((string *)&offset);
              }
            }
            else {
              if (__end2->descriptor_alias != (SPIRVariable *)0x0) {
                local_167a = 1;
                pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1678,
                           "Descriptor aliasing is currently not supported with dynamic offsets.",
                           &local_1679);
                CompilerError::CompilerError(pCVar9,(string *)local_1678);
                local_167a = 0;
                __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                        (&local_1490->member_types,
                         (TypedID<(spirv_cross::Types)1> *)&(var_00->super_IVariant).field_0xc);
              uVar2 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(var_00->super_IVariant).self);
              pmVar10 = ::std::
                        map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                        ::operator[](&this->buffers_requiring_dynamic_offset,&local_1614);
              pmVar10->second = uVar2;
            }
          }
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_1490->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,uVar2,local_1500,SPIRVCrossDecorationResourceIndexPrimary,
                   __end2->index);
        type_00 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_1490->super_IVariant).self);
        uVar2 = local_1500;
        value = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_00->super_IVariant).self);
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,type_00,uVar2,SPIRVCrossDecorationInterfaceOrigID,value);
        local_1500 = local_1500 + 1;
        ::std::__cxx11::string::~string((string *)local_1568);
      }
    }
    resources._4_4_ = resources._4_4_ + 1;
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Handle descriptor aliasing as well as we can.
			// We can handle aliasing of buffers by casting pointers, but not for typed resources.
			// Inline UBOs cannot be handled since it's not a pointer, but inline data.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources_in_set[desc_set])
				{
					if (get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler && is_supported_argument_buffer_type(type))
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				add_resource_name(var_id);

				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources_in_set[desc_set].push_back(
					{ &var, descriptor_alias, to_name(var_id), type.basetype, resource_index, 0 });

				// Emulate texture2D atomic operations
				if (atomic_image_vars.count(var.self))
				{
					uint32_t buffer_resource_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
					resources_in_set[desc_set].push_back(
						{ &var, descriptor_alias, to_name(var_id) + "_atomic", SPIRType::Struct, buffer_resource_index, 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffer_requires_array_length(var_id))
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth++;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, nullptr, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		stable_sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		uint32_t next_arg_buff_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);

			// If needed, synthesize and add padding members.
			// member_index and next_arg_buff_index are incremented when padding members are added.
			if (msl_options.pad_argument_buffer_resources)
			{
				if (!resource.descriptor_alias)
				{
					while (resource.index > next_arg_buff_index)
					{
						auto &rez_bind = get_argument_buffer_resource(desc_set, next_arg_buff_index);
						switch (rez_bind.basetype)
						{
						case SPIRType::Void:
						case SPIRType::Boolean:
						case SPIRType::SByte:
						case SPIRType::UByte:
						case SPIRType::Short:
						case SPIRType::UShort:
						case SPIRType::Int:
						case SPIRType::UInt:
						case SPIRType::Int64:
						case SPIRType::UInt64:
						case SPIRType::AtomicCounter:
						case SPIRType::Half:
						case SPIRType::Float:
						case SPIRType::Double:
							add_argument_buffer_padding_buffer_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Image:
							add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Sampler:
							add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::SampledImage:
							if (next_arg_buff_index == rez_bind.msl_sampler)
								add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							else
								add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						default:
							break;
						}
					}
				}

				// Adjust the number of slots consumed by current member itself.
				// If actual member is an array, allow runtime array resolution as well.
				uint32_t elem_cnt = type.array.empty() ? 1 : to_array_size_literal(type);
				if (elem_cnt == 0)
					elem_cnt = get_resource_array_size(var.self);

				next_arg_buff_index += elem_cnt;
			}

			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with dynamic offsets.");

					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with inline UBOs.");

					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (atomic_image_vars.count(var.self))
				{
					// Emulate texture2D atomic operations.
					// Don't set the qualified name: it's already set for this variable,
					// and the code that references the buffer manually appends "_atomic"
					// to the name.
					uint32_t offset = ir.increase_bound_by(2);
					uint32_t atomic_type_id = offset;
					uint32_t type_ptr_id = offset + 1;

					SPIRType atomic_type;
					atomic_type.basetype = SPIRType::AtomicCounter;
					atomic_type.width = 32;
					atomic_type.vecsize = 1;
					set<SPIRType>(atomic_type_id, atomic_type);

					atomic_type.pointer = true;
					atomic_type.pointer_depth++;
					atomic_type.parent_type = atomic_type_id;
					atomic_type.storage = StorageClassStorageBuffer;
					auto &atomic_ptr_type = set<SPIRType>(type_ptr_id, atomic_type);
					atomic_ptr_type.self = atomic_type_id;

					buffer_type.member_types.push_back(type_ptr_id);
				}
				else
				{
					if (!resource.descriptor_alias || resource.descriptor_alias == resource.var)
						buffer_type.member_types.push_back(var.basetype);

					if (resource.descriptor_alias && resource.descriptor_alias != resource.var)
						buffer_aliases_argument.push_back({ var.self, resource.descriptor_alias->self });
					else if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}